

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeRegListOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  bool bVar1;
  _Bool _Var2;
  uint uVar3;
  DecodeStatus In;
  uint uVar4;
  MCOperand *op;
  uint local_44;
  uint WritebackReg;
  DecodeStatus DStack_38;
  _Bool NeedDisjointWriteback;
  uint opcode;
  DecodeStatus S;
  uint i;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  DStack_38 = MCDisassembler_Success;
  bVar1 = false;
  local_44 = 0;
  _S = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  uVar3 = MCInst_getOpcode(Inst);
  if (((((uVar3 == 0x8f) || (uVar3 == 0x91)) || (uVar3 == 0x94)) ||
      ((uVar3 == 0x96 || (uVar3 == 0x93e)))) ||
     ((uVar3 == 0x941 || ((uVar3 == 0xa24 || (uVar3 == 0xa26)))))) {
    bVar1 = true;
    op = MCInst_getOperand(pMStack_18,0);
    local_44 = MCOperand_getReg(op);
  }
  if (Address_local._4_4_ == 0) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    for (opcode = 0; opcode < 0x10; opcode = opcode + 1) {
      if ((Address_local._4_4_ & 1 << ((byte)opcode & 0x1f)) != 0) {
        In = DecodeGPRRegisterClass(pMStack_18,opcode,(uint64_t)Decoder_local,_S);
        _Var2 = Check(&stack0xffffffffffffffc8,In);
        if (!_Var2) {
          return MCDisassembler_Fail;
        }
        if ((bVar1) &&
           (uVar4 = MCOperand_getReg(pMStack_18->Operands + (int)(pMStack_18->size - 1)),
           local_44 == uVar4)) {
          Check(&stack0xffffffffffffffc8,MCDisassembler_SoftFail);
        }
      }
    }
    if (((uVar3 == 0x941) && (local_44 == 0xc)) &&
       (((Address_local._4_4_ & 0x2000) != 0 ||
        (((Address_local._4_4_ & 0x8000) != 0 && ((Address_local._4_4_ & 0x4000) != 0)))))) {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
    else {
      Inst_local._4_4_ = DStack_38;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeRegListOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	unsigned i;
	DecodeStatus S = MCDisassembler_Success;
	unsigned opcode;

	bool NeedDisjointWriteback = false;
	unsigned WritebackReg = 0;

	opcode = MCInst_getOpcode(Inst);
	switch (opcode) {
		default:
			break;
		case ARM_LDMIA_UPD:
		case ARM_LDMDB_UPD:
		case ARM_LDMIB_UPD:
		case ARM_LDMDA_UPD:
		case ARM_t2LDMIA_UPD:
		case ARM_t2LDMDB_UPD:
		case ARM_t2STMIA_UPD:
		case ARM_t2STMDB_UPD:
			NeedDisjointWriteback = true;
			WritebackReg = MCOperand_getReg(MCInst_getOperand(Inst, 0));
			break;
	}

	// Empty register lists are not allowed.
	if (Val == 0) return MCDisassembler_Fail;
	for (i = 0; i < 16; ++i) {
		if (Val & (1 << i)) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, i, Address, Decoder)))
				return MCDisassembler_Fail;
			// Writeback not allowed if Rn is in the target list.
			if (NeedDisjointWriteback && WritebackReg == MCOperand_getReg(&(Inst->Operands[Inst->size-1])))
				Check(&S, MCDisassembler_SoftFail);
		}
	}

	if (opcode == ARM_t2LDMIA_UPD && WritebackReg == ARM_SP) {
		if (Val & (1 << 13) || ((Val & (1 << 15)) && (Val & (1 << 14)))) {
			// invalid thumb2 pop
			// needs no sp in reglist and not both pc and lr set at the same time
			return MCDisassembler_Fail;
		}
	}

	return S;
}